

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBAmrUtil.cpp
# Opt level: O1

void amrex::TagCutCells(TagBoxArray *tags,MultiFab *state)

{
  int iVar1;
  int iVar2;
  EBCellFlagFab *this;
  FabArray<amrex::EBCellFlagFab> *pFVar3;
  FabType FVar4;
  long lVar5;
  FabArray<amrex::EBCellFlagFab> *pFVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  long lVar12;
  long lVar13;
  MFIter mfi;
  Box local_10c;
  FabArray<amrex::EBCellFlagFab> *local_f0;
  FabArray<amrex::TagBox> *local_e8;
  ulong local_e0;
  long local_d8;
  Array4<char> local_d0;
  MFIter local_90;
  
  local_e8 = &tags->super_FabArray<amrex::TagBox>;
  lVar5 = __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar5 == 0) {
    __cxa_bad_cast();
  }
  pFVar6 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar5 + 0xd8));
  MFIter::MFIter(&local_90,(FabArrayBase *)state,true);
  pFVar3 = pFVar6;
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      local_f0 = pFVar3;
      piVar7 = &local_90.currentIndex;
      MFIter::tilebox(&local_10c,&local_90);
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar7 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      this = (pFVar6->m_fabs_v).
             super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*piVar7];
      FVar4 = EBCellFlagFab::getType(this,&local_10c);
      if ((uint)(FVar4 + covered) < 0xfffffffe) {
        FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(&local_d0,local_e8,&local_90);
        lVar5 = (long)local_10c.smallend.vect[2];
        pFVar6 = local_f0;
        if (local_10c.smallend.vect[2] <= local_10c.bigend.vect[2]) {
          iVar1 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[0];
          iVar2 = (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
          lVar9 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0] - iVar1) +
                        1);
          lVar8 = (long)(((this->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] - iVar2) +
                        1);
          local_e0 = (ulong)(uint)local_10c.bigend.vect[1];
          puVar11 = (uint32_t *)
                    ((long)&(this->super_BaseFab<amrex::EBCellFlag>).dptr
                            [(long)local_10c.smallend.vect[0] - (long)iVar1].flag +
                    ((long)local_10c.smallend.vect[1] * 4 +
                     (lVar5 - (this->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2]) *
                     lVar8 * 4 + (long)iVar2 * -4) * lVar9);
          lVar8 = lVar8 * lVar9;
          local_d8 = lVar8 * 4;
          do {
            puVar10 = puVar11;
            lVar12 = (long)local_10c.smallend.vect[1];
            if (local_10c.smallend.vect[1] <= local_10c.bigend.vect[1]) {
              do {
                if (local_10c.smallend.vect[0] <= local_10c.bigend.vect[0]) {
                  lVar13 = 0;
                  do {
                    if ((puVar10[lVar13] & 3) == 1) {
                      local_d0.p
                      [lVar13 + (long)local_10c.smallend.vect[0] +
                                (((lVar12 - local_d0.begin.y) * local_d0.jstride +
                                 (lVar5 - local_d0.begin.z) * local_d0.kstride) -
                                (long)local_d0.begin.x)] = '\x02';
                    }
                    lVar13 = lVar13 + 1;
                  } while ((local_10c.bigend.vect[0] - local_10c.smallend.vect[0]) + 1 !=
                           (int)lVar13);
                }
                lVar12 = lVar12 + 1;
                puVar10 = puVar10 + lVar9;
              } while (local_10c.bigend.vect[1] + 1U != (int)lVar12);
            }
            lVar5 = lVar5 + 1;
            puVar11 = puVar11 + lVar8;
          } while (local_10c.bigend.vect[2] + 1 != (int)lVar5);
        }
      }
      MFIter::operator++(&local_90);
      pFVar3 = local_f0;
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
TagCutCells (TagBoxArray& tags, const MultiFab& state)
{
    const char   tagval = TagBox::SET;
//    const char clearval = TagBox::CLEAR;

    auto const& factory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = factory.getMultiEBCellFlagFab();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(state, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        const auto& flag = flags[mfi];

        const FabType typ = flag.getType(bx);
        if (typ != FabType::regular && typ != FabType::covered)
        {
            Array4<char> const& tagarr = tags.array(mfi);
            Array4<EBCellFlag const> const& flagarr = flag.const_array();
            AMREX_HOST_DEVICE_FOR_3D (bx, i, j, k,
            {
                if (flagarr(i,j,k).isSingleValued()) {
                    tagarr(i,j,k) = tagval;
                }
            });
        }
    }
}